

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

void xmlTextReaderFreeProp(xmlTextReaderPtr reader,xmlAttrPtr cur)

{
  xmlNodePtr elem;
  xmlDocPtr pxVar1;
  xmlHashTablePtr pxVar2;
  xmlParserCtxtPtr pxVar3;
  int iVar4;
  xmlDeregisterNodeFunc *pp_Var5;
  xmlChar *pxVar6;
  void *pvVar7;
  xmlListPtr l;
  xmlDictPtr dict;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = reader->ctxt->dict;
  }
  if (__xmlRegisterCallbacks != 0) {
    pp_Var5 = __xmlDeregisterNodeDefaultValue();
    if (*pp_Var5 != (xmlDeregisterNodeFunc)0x0) {
      pp_Var5 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var5)((xmlNodePtr)cur);
    }
  }
  elem = cur->parent;
  if ((elem != (xmlNodePtr)0x0) && (elem->doc != (xmlDocPtr)0x0)) {
    iVar4 = xmlIsID(elem->doc,elem,cur);
    if ((iVar4 != 0) &&
       ((pxVar1 = cur->parent->doc, pxVar1 != (xmlDocPtr)0x0 &&
        (pxVar2 = (xmlHashTablePtr)pxVar1->ids, pxVar2 != (xmlHashTablePtr)0x0)))) {
      pxVar6 = xmlNodeListGetString(pxVar1,cur->children,1);
      if (pxVar6 != (xmlChar *)0x0) {
        pvVar7 = xmlHashLookup(pxVar2,pxVar6);
        (*xmlFree)(pxVar6);
        if ((pvVar7 != (void *)0x0) && (*(xmlAttrPtr *)((long)pvVar7 + 0x10) == cur)) {
          *(xmlChar **)((long)pvVar7 + 0x18) = cur->name;
          cur->name = (xmlChar *)0x0;
          *(undefined8 *)((long)pvVar7 + 0x10) = 0;
        }
      }
    }
    pxVar1 = cur->parent->doc;
    if ((pxVar1->intSubset != (_xmlDtd *)0x0) || (pxVar1->extSubset != (_xmlDtd *)0x0)) {
      iVar4 = xmlIsRef(pxVar1,cur->parent,cur);
      if ((iVar4 != 0) &&
         ((pxVar1 = cur->parent->doc, pxVar1 != (xmlDocPtr)0x0 &&
          (pxVar2 = (xmlHashTablePtr)pxVar1->refs, pxVar2 != (xmlHashTablePtr)0x0)))) {
        pxVar6 = xmlNodeListGetString(pxVar1,cur->children,1);
        if (pxVar6 != (xmlChar *)0x0) {
          l = (xmlListPtr)xmlHashLookup(pxVar2,pxVar6);
          (*xmlFree)(pxVar6);
          if (l != (xmlListPtr)0x0) {
            xmlListWalk(l,xmlTextReaderWalkRemoveRef,cur);
          }
        }
      }
    }
  }
  if (cur->children != (xmlNodePtr)0x0) {
    xmlTextReaderFreeNodeList(reader,cur->children);
  }
  pxVar6 = cur->name;
  if (pxVar6 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar4 = xmlDictOwns(dict,pxVar6);
      if (iVar4 != 0) goto LAB_0019f33f;
      pxVar6 = cur->name;
    }
    (*xmlFree)(pxVar6);
  }
LAB_0019f33f:
  pxVar3 = reader->ctxt;
  if ((pxVar3 != (xmlParserCtxtPtr)0x0) && (iVar4 = pxVar3->freeAttrsNr, iVar4 < 100)) {
    cur->next = pxVar3->freeAttrs;
    pxVar3->freeAttrs = cur;
    pxVar3->freeAttrsNr = iVar4 + 1;
    return;
  }
  (*xmlFree)(cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeProp(xmlTextReaderPtr reader, xmlAttrPtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur == NULL) return;

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr) cur);

    /* Check for ID removal -> leading to invalid references ! */
    if ((cur->parent != NULL) && (cur->parent->doc != NULL)) {
        if (xmlIsID(cur->parent->doc, cur->parent, cur))
	    xmlTextReaderRemoveID(cur->parent->doc, cur);
	if (((cur->parent->doc->intSubset != NULL) ||
	     (cur->parent->doc->extSubset != NULL)) &&
            (xmlIsRef(cur->parent->doc, cur->parent, cur)))
            xmlTextReaderRemoveRef(cur->parent->doc, cur);
    }
    if (cur->children != NULL)
        xmlTextReaderFreeNodeList(reader, cur->children);

    DICT_FREE(cur->name);
    if ((reader != NULL) && (reader->ctxt != NULL) &&
        (reader->ctxt->freeAttrsNr < MAX_FREE_NODES)) {
        cur->next = reader->ctxt->freeAttrs;
	reader->ctxt->freeAttrs = cur;
	reader->ctxt->freeAttrsNr++;
    } else {
	xmlFree(cur);
    }
}